

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O0

void __thiscall QDataWidgetMapper::setCurrentModelIndex(QDataWidgetMapper *this,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QDataWidgetMapperPrivate *pQVar4;
  QAbstractItemModel *pQVar5;
  QModelIndex *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QDataWidgetMapperPrivate *d;
  QPersistentModelIndex *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined7 in_stack_ffffffffffffffc0;
  bool bVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QDataWidgetMapper *)0x87182f);
  bVar2 = QModelIndex::isValid
                    ((QModelIndex *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  bVar6 = true;
  if (bVar2) {
    pQVar5 = QModelIndex::model((QModelIndex *)0x871857);
    bVar6 = true;
    if (pQVar5 == pQVar4->model) {
      QModelIndex::parent((QModelIndex *)CONCAT17(1,in_stack_ffffffffffffffc0));
      bVar6 = ::operator!=((QModelIndex *)
                           CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                           in_stack_ffffffffffffffa8);
    }
  }
  if (bVar6 == false) {
    if (pQVar4->orientation == Horizontal) {
      iVar3 = QModelIndex::row(in_RSI);
    }
    else {
      iVar3 = QModelIndex::column(in_RSI);
    }
    (**(code **)(*in_RDI + 0x60))(in_RDI,iVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDataWidgetMapper::setCurrentModelIndex(const QModelIndex &index)
{
    Q_D(QDataWidgetMapper);

    if (!index.isValid()
        || index.model() != d->model
        || index.parent() != d->rootIndex)
        return;

    setCurrentIndex(d->orientation == Qt::Horizontal ? index.row() : index.column());
}